

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOManager.cpp
# Opt level: O2

Mat * IOManager::secret_share_kv_data(int *data,int size,string *prefix,bool isFreq)

{
  Mat *pMVar1;
  undefined1 v [16];
  ostream *poVar2;
  undefined8 *puVar3;
  ll lVar4;
  ulong uVar5;
  Mat *pMVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined8 in_stack_fffffffffffffeb8;
  vector<long_long,_std::allocator<long_long>_> coefficients;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  out_files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string filename;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Vector_base<long_long,_std::allocator<long_long>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = (ulong)(uint)size;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&coefficients,2,(allocator_type *)&filename);
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector(&out_files,3,(allocator_type *)&filename);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)prefix);
  poVar2 = std::operator<<(poVar2," size: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)uVar7);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)operator_new__(0x80);
  *puVar3 = 3;
  pMVar1 = (Mat *)(puVar3 + 1);
  lVar9 = 0;
  pMVar6 = pMVar1;
  do {
    Mat::Mat(pMVar6);
    lVar9 = lVar9 + -0x28;
    pMVar6 = pMVar6 + 1;
  } while (lVar9 != -0x78);
  lVar9 = 0;
  pMVar6 = pMVar1;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    Mat::init(pMVar6,(EVP_PKEY_CTX *)0x1);
    std::operator+(&local_88,"output/",prefix);
    std::operator+(&local_e8,&local_88,"_");
    std::__cxx11::to_string(&local_a8,(int)lVar10);
    std::operator+(&local_50,&local_e8,&local_a8);
    std::operator+(&filename,&local_50,".csv");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_88);
    poVar2 = std::operator<<((ostream *)&std::cout,"File: ");
    poVar2 = std::operator<<(poVar2,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::open((string *)
                        (out_files.
                         super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),(_Ios_Openmode)&filename
                       );
    std::__cxx11::string::~string((string *)&filename);
    pMVar6 = pMVar6 + 1;
    lVar9 = lVar9 + 0x200;
  }
  lVar4 = Constant::Util::randomlong();
  coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = lVar4;
  uVar8 = 0;
  uVar5 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar5 = uVar8;
  }
  for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
    lVar4 = Constant::Util::randomlong();
    coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] = lVar4;
    uVar7 = (ulong)(0 < (long)data[uVar8]);
    if (!isFreq) {
      uVar7 = (long)data[uVar8];
    }
    *coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
     super__Vector_impl_data._M_start = uVar7 << 0x14;
    lVar10 = 0;
    pMVar6 = pMVar1;
    for (lVar9 = 2; lVar9 != 5; lVar9 = lVar9 + 1) {
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)&local_68,&coefficients);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_68);
      poVar2 = std::ostream::_M_insert<long_long>
                         ((longlong)
                          (out_files.
                           super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar10));
      std::operator<<(poVar2,",");
      v._8_8_ = uVar5;
      v._0_8_ = in_stack_fffffffffffffeb8;
      Mat::setVal(pMVar6,(int)uVar8,(ll128)v);
      pMVar6 = pMVar6 + 1;
      lVar10 = lVar10 + 0x200;
    }
  }
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~vector(&out_files);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&coefficients.super__Vector_base<long_long,_std::allocator<long_long>_>);
  return pMVar1;
}

Assistant:

Mat* IOManager::secret_share_kv_data(int* data, int size, string prefix, bool isFreq) {
    vector<ll> coefficients(TN);
    vector<ofstream> out_files(M);
    cout << prefix << " size: " << size << endl;

    Mat* res = new Mat[M];
//    Mat res(1, size);
    for (int i = 0; i < M; ++i) {
        res[i].init(1, size);
        string filename = "output/"+prefix+"_"+to_string(i)+".csv";
        cout << "File: " << filename << endl;
        out_files[i].open(filename, ios::out);
    }
    /// 简化计算，TODO，delete
    for (int j = 1; j < TN; ++j) {
        coefficients[j] = Constant::Util::randomlong();
    }
//    for (int j = 0; j < TN; ++j) {
//        cout << j << ": " << coefficients[j] << endl;
//    }
    for (int i = 0; i < size; ++i) {
        for (int j = 1; j < TN; ++j) {
            coefficients[j] = Constant::Util::randomlong();
        }
        if (isFreq) {
            if (data[i] > 0) {
                coefficients[0] = IE;
            } else {
                coefficients[0] = 0;
            }
        } else {
            coefficients[0] = data[i] * IE;
        }

        for (int k = 0; k < M; ++k) {
            ll tmp = poly_eval(coefficients, k + 2);
            out_files[k] << tmp << ",";
            res[k].setVal(i, tmp);
//            if(k==node_type){
//                res.setVal(i, tmp);
//            }
        }
//        for (int l = 0; l < TN; ++l) {
//            DBGprint("%lld, ", coefficients[l]);
//        }
//        cout << endl;
    }
//    res[0].print();
    return res;
}